

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O0

PropertyAttributes
Js::PropertyRecord::DefaultAttributesForPropertyId(PropertyId propertyId,bool __proto__AsDeleted)

{
  bool __proto__AsDeleted_local;
  PropertyId propertyId_local;
  
  if (propertyId == 0x1eb) {
    if (__proto__AsDeleted) {
      __proto__AsDeleted_local = true;
    }
    else {
      __proto__AsDeleted_local = true;
    }
  }
  else {
    __proto__AsDeleted_local = true;
  }
  return __proto__AsDeleted_local;
}

Assistant:

PropertyAttributes PropertyRecord::DefaultAttributesForPropertyId(PropertyId propertyId, bool __proto__AsDeleted)
    {
        switch (propertyId)
        {
        case PropertyIds::__proto__:
            if (__proto__AsDeleted)
            {
                //
                // If the property name is __proto__, it could be either [[prototype]] or ignored, or become a local
                // property depending on later environment and property value. To maintain enumeration order when it
                // becomes a local property, add the entry as deleted.
                //
                return PropertyDeletedDefaults;
            }
            return PropertyDynamicTypeDefaults;

        default:
            return PropertyDynamicTypeDefaults;
        }
    }